

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-nodes.cc
# Opt level: O3

void __thiscall
dynet::InputNode::forward_impl
          (InputNode *this,vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs
          ,Tensor *fx)

{
  runtime_error *this_00;
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  
  if (fx->device->type == CPU) {
    uVar1 = (ulong)(this->dim).nd;
    iVar2 = 1;
    if (uVar1 != 0) {
      uVar3 = 0;
      do {
        iVar2 = iVar2 * (this->dim).d[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
    memcpy(fx->v,(this->pdata->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start,(ulong)(iVar2 * (this->dim).bd) << 2);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Invalid device in MyNode::forward_impl");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SparseInputNode::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
  DYNET_ASSERT(xs.size() == 0, "Failed dimension check in FUNCNAME");
  fx.tvec().device(*dev.edevice) = fx.tvec().constant(defdata);
#ifdef __CUDACC__
  unsigned int* ids_ptr = (unsigned int*)aux_mem;
  float* data_ptr = (float*)(ids_ptr + ids.size());
  cudaMemcpyAsync(ids_ptr, &ids[0], ids.size() * sizeof(unsigned int), cudaMemcpyHostToDevice);
  cudaMemcpyAsync(data_ptr, &data[0], data.size() * sizeof(float), cudaMemcpyHostToDevice);
  dynet::gpu::dense_to_sparse_assign(ids.size(), ids_ptr, data_ptr, fx.v);
#else
  for(size_t i = 0; i < ids.size(); ++i)
    fx.v[ids[i]] = data[i];
#endif
}